

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void multi_process_server(int port,string *ip,string *log_file)

{
  int sockfd;
  __pid_t _Var1;
  int iVar2;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  client_socket client;
  string local_80;
  Log log;
  
  Log::Log(&log,log_file);
  sockfd = C_std::Network::Socket(2,1,0);
  std::__cxx11::string::string((string *)&local_80,(string *)ip);
  C_std::Network::easy_bind(sockfd,port,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  C_std::Network::Listen(sockfd,0x80);
  catch_signal();
  iVar2 = 0;
  do {
    C_std::Network::easy_accept(&client,sockfd);
    _Var1 = fork();
    if (_Var1 < 0) {
      std::__cxx11::string::string((string *)&local_170,"fork error",(allocator *)&local_150);
      perror_exit(&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
    else {
      if (_Var1 == 0) {
        C_std::Close(sockfd);
        std::__cxx11::to_string(&local_110,iVar2 + 1);
        std::operator+(&local_f0,&local_110,"th client connected : ");
        std::operator+(&local_d0,&local_f0,&client.ip);
        std::operator+(&local_150,&local_d0," : ");
        std::__cxx11::to_string(&local_130,client.port);
        std::operator+(&local_170,&local_150,&local_130);
        Log::print(&log,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        server_func(&client);
        std::__cxx11::to_string(&local_110,iVar2 + 1);
        std::operator+(&local_f0,&local_110,"th client disconnect: ");
        std::operator+(&local_d0,&local_f0,&client.ip);
        std::operator+(&local_150,&local_d0," : ");
        std::__cxx11::to_string(&local_130,client.port);
        std::operator+(&local_170,&local_150,&local_130);
        Log::print(&log,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        exit(1);
      }
      C_std::Close(client.sockfd);
      iVar2 = iVar2 + 1;
    }
    std::__cxx11::string::~string((string *)&client.ip);
  } while( true );
}

Assistant:

void multi_process_server(int port, const std::string &ip, const std::string &log_file) {
    int client_num = 0;
    Log log(log_file);
    int listened_sockfd = Socket(AF_INET, SOCK_STREAM, 0);
    easy_bind(listened_sockfd, port, ip);
    Listen(listened_sockfd, 128);

    catch_signal();

    while(1) {
        client_socket client(easy_accept(listened_sockfd));
        pid_t pid = fork();
        if (pid < 0) {
            perror_exit("fork error");
        } else if (pid == 0) {
            //子进程逻辑
            Close(listened_sockfd);
            log.print(std::to_string(client_num + 1) + "th client connected : " + client.ip + " : " + std::to_string(client.port));
            server_func(client);
            log.print(std::to_string(client_num + 1) + "th client disconnect: " + client.ip + " : " + std::to_string(client.port));
            exit(1);
        } else {
            //父进程逻辑
            Close(client.sockfd);
            ++client_num;
        }
    }
}